

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Maybe<kj::String> * __thiscall
kj::anon_unknown_36::WebSocketPipeEnd::getPreferredExtensions
          (Maybe<kj::String> *__return_storage_ptr__,WebSocketPipeEnd *this,ExtensionsContext ctx)

{
  WebSocket *pWVar1;
  bool bVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  WebSocketPipeImpl *pWVar5;
  undefined8 unaff_R12;
  undefined8 unaff_R13;
  undefined8 uVar6;
  undefined8 unaff_R15;
  NullableValue<kj::String> _result4505;
  NullableValue<kj::String> local_78;
  NullableValue<kj::String> local_58;
  undefined1 *local_38;
  
  pWVar5 = (this->out).own.ptr;
  pWVar1 = (pWVar5->destinationPumpingTo).ptr;
  if (pWVar1 == (WebSocket *)0x0) {
LAB_0031ff83:
    pWVar1 = (pWVar5->destinationPumpingFrom).ptr;
    if (pWVar1 != (WebSocket *)0x0) {
      (*pWVar1->_vptr_WebSocket[0xb])(&local_78,pWVar1,(ulong)ctx);
      uVar4 = local_78.field_1.value.content.size_;
      uVar3 = local_78.field_1.value.content.ptr;
      local_58.isSet = local_78.isSet;
      uVar6 = &local_78;
      if (local_78.isSet == true) {
        local_58.field_1.value.content.ptr = local_78.field_1.value.content.ptr;
        local_58.field_1.value.content.size_ = local_78.field_1.value.content.size_;
        local_58.field_1.value.content.disposer = local_78.field_1.value.content.disposer;
        local_78.field_1.value.content.ptr = (char *)0x0;
        local_78.field_1.value.content.size_ = 0;
        unaff_R12 = uVar3;
        uVar6 = uVar4;
        unaff_R15 = local_78.field_1.value.content.disposer;
      }
      kj::_::NullableValue<kj::String>::~NullableValue(&local_78);
      if (local_78.isSet != false) {
        (__return_storage_ptr__->ptr).isSet = true;
        (__return_storage_ptr__->ptr).field_1.value.content.ptr = (char *)unaff_R12;
        (__return_storage_ptr__->ptr).field_1.value.content.size_ = uVar6;
        (__return_storage_ptr__->ptr).field_1.value.content.disposer = (ArrayDisposer *)unaff_R15;
        goto LAB_0031ffec;
      }
      kj::_::NullableValue<kj::String>::~NullableValue(&local_58);
    }
    (__return_storage_ptr__->ptr).isSet = false;
  }
  else {
    (*pWVar1->_vptr_WebSocket[0xb])(&local_78,pWVar1,(ulong)ctx);
    uVar3 = local_78.field_1.value.content.ptr;
    bVar2 = local_78.isSet;
    unaff_R15 = CONCAT71((int7)((ulong)&local_78 >> 8),local_78.isSet);
    local_58.isSet = local_78.isSet;
    if (local_78.isSet == true) {
      local_58.field_1.value.content.ptr = local_78.field_1.value.content.ptr;
      local_38 = (undefined1 *)local_78.field_1.value.content.size_;
      local_58.field_1.value.content.size_ = local_78.field_1.value.content.size_;
      local_58.field_1.value.content.disposer = local_78.field_1.value.content.disposer;
      local_78.field_1.value.content.ptr = (char *)0x0;
      local_78.field_1.value.content.size_ = 0;
      unaff_R12 = uVar3;
      unaff_R13 = local_78.field_1.value.content.disposer;
    }
    kj::_::NullableValue<kj::String>::~NullableValue(&local_78);
    if (bVar2 == false) {
      kj::_::NullableValue<kj::String>::~NullableValue(&local_58);
      pWVar5 = (this->out).own.ptr;
      goto LAB_0031ff83;
    }
    (__return_storage_ptr__->ptr).isSet = true;
    (__return_storage_ptr__->ptr).field_1.value.content.ptr = (char *)unaff_R12;
    (__return_storage_ptr__->ptr).field_1.value.content.size_ = (size_t)local_38;
    (__return_storage_ptr__->ptr).field_1.value.content.disposer = (ArrayDisposer *)unaff_R13;
LAB_0031ffec:
    local_58.field_1.value.content.ptr = (char *)0x0;
    local_58.field_1.value.content.size_ = 0;
    kj::_::NullableValue<kj::String>::~NullableValue(&local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<kj::String> getPreferredExtensions(ExtensionsContext ctx) override {
    // We want to forward this call to whatever WebSocket the other end of the pipe is pumping
    // to/from, if any. We'll check them in an arbitrary order and take the first one we see.
    // But really, the hope is that both destinationPumpingTo and destinationPumpingFrom are in fact
    // the same object. If they aren't the same, then it's not really clear whose extensions we
    // should prefer; the choice here is arbitrary.
    KJ_IF_SOME(ws, out->destinationPumpingTo) {
      KJ_IF_SOME(result, ws.getPreferredExtensions(ctx)) {
        return kj::mv(result);
      }
    }
    KJ_IF_SOME(ws, out->destinationPumpingFrom) {
      KJ_IF_SOME(result, ws.getPreferredExtensions(ctx)) {
        return kj::mv(result);
      }
    }
    return kj::none;
  }